

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::preRender
          (VaryingOutputCountCase *this,Context *ctx,GLuint programID)

{
  uint uVar1;
  TestError *pTVar2;
  allocator<char> local_b1;
  string local_b0;
  uint local_90;
  uint local_8c;
  GLuint texID;
  int location_1;
  deUint8 data [16];
  allocator<char> local_59;
  string local_58;
  undefined4 local_38;
  undefined4 local_34;
  deInt32 emitCount [4];
  int location;
  GLuint programID_local;
  Context *ctx_local;
  VaryingOutputCountCase *this_local;
  
  if (this->m_test == READ_UNIFORM) {
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)programID,"u_emitCount");
    local_38 = 6;
    local_34 = 0;
    emitCount[0] = this->m_maxEmitCount;
    emitCount[1] = 10;
    if (uVar1 == 0xffffffff) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"uniform location of u_emitCount was -1.",&local_59);
      tcu::TestError::TestError(pTVar2,&local_58);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*ctx->_vptr_Context[99])(ctx,(ulong)uVar1,1,&local_38);
  }
  else if (this->m_test == READ_TEXTURE) {
    _texID = 0xff00000000ff;
    data[0] = '\0';
    data[1] = '\0';
    data[2] = 0xff;
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = 0xff;
    local_8c = (*ctx->_vptr_Context[0x66])(ctx,(ulong)programID,"u_sampler");
    local_90 = 0;
    if (local_8c == 0xffffffff) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"uniform location of u_sampler was -1.",&local_b1);
      tcu::TestError::TestError(pTVar2,&local_b0);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*ctx->_vptr_Context[0x5b])(ctx,(ulong)local_8c,0);
    (*ctx->_vptr_Context[7])(ctx,1,&local_90);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)local_90);
    (*ctx->_vptr_Context[0x11])(ctx,0xde1,0,0x8058,4,1,0,0x1908,0x1401,&texID);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
    (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
  }
  return;
}

Assistant:

void VaryingOutputCountCase::preRender (sglr::Context& ctx, GLuint programID)
{
	if (m_test == VaryingOutputCountShader::READ_UNIFORM)
	{
		const int		location		= ctx.getUniformLocation(programID, "u_emitCount");
		const deInt32	emitCount[4]	= { 6, 0, m_maxEmitCount, 10 };

		if (location == -1)
			throw tcu::TestError("uniform location of u_emitCount was -1.");

		ctx.uniform4iv(location, 1, emitCount);
	}
	else if (m_test == VaryingOutputCountShader::READ_TEXTURE)
	{
		const deUint8 data[4*4] =
		{
			255,   0,   0,   0,
			  0, 255,   0,   0,
			  0,   0, 255,   0,
			  0,   0,   0, 255,
		};
		const int	location	= ctx.getUniformLocation(programID, "u_sampler");
		GLuint		texID		= 0;

		if (location == -1)
			throw tcu::TestError("uniform location of u_sampler was -1.");
		ctx.uniform1i(location, 0);

		// \note we don't need to explicitly delete the texture, the sglr context will delete it
		ctx.genTextures(1, &texID);
		ctx.bindTexture(GL_TEXTURE_2D, texID);
		ctx.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, 4, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
		ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	}
}